

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_c_api_usecase1.cpp
# Opt level: O2

void call_server1(void)

{
  bool bVar1;
  size_t buffer_size;
  char *buffer;
  char_array_list data;
  size_t local_40;
  char *local_38;
  debug_memory_resource *local_30;
  char_array_list local_28;
  
  local_38 = (char *)0x0;
  local_40 = 0;
  bVar1 = server_api_call1(&local_38,&local_40);
  if (bVar1) {
    local_30 = &global_memory_resource;
    iffl::
    flat_forward_list<pod_array_list_entry<char>,iffl::flat_forward_list_traits<pod_array_list_entry<char>>,std::pmr::polymorphic_allocator<char>>
    ::flat_forward_list<iffl::debug_memory_resource*>(&local_28,local_38,local_40);
    process_data1(&local_28);
    iffl::
    flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
    ::clear(&local_28);
  }
  else if ((local_38 != (char *)0x0) || (local_40 != 0)) {
    std::terminate();
  }
  return;
}

Assistant:

void call_server1() {
    char *buffer{ nullptr };
    size_t buffer_size{ 0 };

    if (server_api_call1(&buffer, &buffer_size)) {
        //
        // If server call succeeded the 
        // take ownership of the buffer
        //
        char_array_list data{ iffl::attach_buffer{},
                              buffer, 
                              buffer_size,
                              &global_memory_resource };
        process_data1(data);
    } else {
        FFL_CODDING_ERROR_IF(buffer || buffer_size);
    }
}